

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow *window)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x3b0) = 1;
  *(undefined4 *)(in_RDI + 0x3b4) = *(undefined4 *)(*(long *)(in_RDI + 0x2b0) + 0x14);
  *(undefined4 *)(in_RDI + 0x3b8) = *(undefined4 *)(*(long *)(in_RDI + 0x2b0) + 0x24);
  ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)window);
  ImDrawList::ClearFreeMemory((ImDrawList *)window);
  ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)window);
  ImVector<int>::clear((ImVector<int> *)window);
  ImVector<float>::clear((ImVector<float> *)window);
  ImVector<float>::clear((ImVector<float> *)window);
  ImVector<ImGuiGroupData>::clear((ImVector<ImGuiGroupData> *)window);
  return;
}

Assistant:

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow* window)
{
    window->MemoryCompacted = true;
    window->MemoryDrawListIdxCapacity = window->DrawList->IdxBuffer.Capacity;
    window->MemoryDrawListVtxCapacity = window->DrawList->VtxBuffer.Capacity;
    window->IDStack.clear();
    window->DrawList->ClearFreeMemory();
    window->DC.ChildWindows.clear();
    window->DC.ItemFlagsStack.clear();
    window->DC.ItemWidthStack.clear();
    window->DC.TextWrapPosStack.clear();
    window->DC.GroupStack.clear();
}